

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,Block *block)

{
  FuncSignature *sig;
  pointer *ppLVar1;
  pointer pTVar2;
  pointer pTVar3;
  undefined1 in_R8B;
  string_view name;
  string local_70 [32];
  string label;
  
  name._M_str = (block->label)._M_dataplus._M_p;
  name._M_len = (block->label)._M_string_length;
  (anonymous_namespace)::CWriter::DefineLabelName_abi_cxx11_(&label,(CWriter *)this,name);
  sig = &(block->decl).sig;
  DropTypes(this,(ulong)((long)(block->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(block->decl).sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
  pTVar2 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar3 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  PushLabel(this,Block,&block->label,sig,(bool)in_R8B);
  PushTypes(this,&sig->param_types);
  std::__cxx11::string::string(local_70,(string *)&label);
  (anonymous_namespace)::CWriter::
  Write<wabt::intrusive_list<wabt::Expr>const&,wabt::(anonymous_namespace)::LabelDecl>
            ((CWriter *)this,&block->exprs,(LabelDecl *)local_70);
  std::__cxx11::string::_M_dispose();
  ResetTypeStack(this,(long)pTVar2 - (long)pTVar3 >> 3);
  ppLVar1 = &(this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppLVar1 = *ppLVar1 + -1;
  PushTypes(this,&(block->decl).sig.result_types);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void CWriter::Write(const Block& block) {
  std::string label = DefineLabelName(block.label);
  DropTypes(block.decl.GetNumParams());
  size_t mark = MarkTypeStack();
  PushLabel(LabelType::Block, block.label, block.decl.sig);
  PushTypes(block.decl.sig.param_types);
  Write(block.exprs, LabelDecl(label));
  ResetTypeStack(mark);
  PopLabel();
  PushTypes(block.decl.sig.result_types);
}